

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall nivalis::color::color::color(color *this,uint clr)

{
  undefined4 in_ESI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  color((color *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
        in_stack_ffffffffffffffe8,0,0x13b081);
  return;
}

Assistant:

color::color(unsigned clr)
    : color((clr& 0xFF0000) >> 16,
            (clr& 0xFF00) >> 8,
            clr& 0xFF, 255){}